

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * __thiscall Lowerer::LoadLibraryValueOpnd(Lowerer *this,Instr *instr,LibraryValue valueType)

{
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  intptr_t iVar5;
  MemRefOpnd *pMVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 *puVar7;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  AddrOpnd *pAVar8;
  Func *func;
  AddrOpndKind addrOpndKind;
  
  if (0x18 < valueType - ValueUndeclBlockVar) {
switchD_005c1043_caseD_f:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xc9d,"((0))","UNREACHED");
    if (bVar3) {
      *puVar7 = 0;
      return (Opnd *)0x0;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  pSVar1 = instr->m_func->m_scriptContextInfo;
  switch(valueType) {
  case ValueUndeclBlockVar:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[4])();
    iVar5 = CONCAT44(extraout_var,iVar4);
    break;
  case ValueEmptyString:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[5])();
    iVar5 = CONCAT44(extraout_var_07,iVar4);
    break;
  case ValueUndefined:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[1])();
    iVar5 = CONCAT44(extraout_var_04,iVar4);
    break;
  case ValueNull:
    iVar4 = (**pSVar1->_vptr_ScriptContextInfo)();
    iVar5 = CONCAT44(extraout_var_12,iVar4);
    break;
  case ValueTrue:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[2])();
    iVar5 = CONCAT44(extraout_var_13,iVar4);
    break;
  case ValueFalse:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[3])();
    iVar5 = CONCAT44(extraout_var_05,iVar4);
    break;
  case ValueNegativeZero:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[6])();
    iVar5 = CONCAT44(extraout_var_08,iVar4);
    break;
  case ValueNumberTypeStatic:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[7])();
    iVar5 = CONCAT44(extraout_var_09,iVar4);
    goto LAB_005c1191;
  case ValueStringTypeStatic:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[8])();
    iVar5 = CONCAT44(extraout_var_15,iVar4);
    goto LAB_005c1191;
  case ValueSymbolTypeStatic:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[9])();
    iVar5 = CONCAT44(extraout_var_14,iVar4);
LAB_005c1191:
    func = instr->m_func;
    addrOpndKind = AddrOpndKindDynamicType;
    goto LAB_005c119d;
  case ValueObjectType:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[10])();
    iVar5 = CONCAT44(extraout_var_01,iVar4);
    goto LAB_005c11c4;
  case ValueObjectHeaderInlinedType:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0xb])();
    iVar5 = CONCAT44(extraout_var_06,iVar4);
    goto LAB_005c11c4;
  case ValueRegexType:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0xc])();
    iVar5 = CONCAT44(extraout_var_02,iVar4);
    goto LAB_005c11c4;
  case ValueArrayConstructor:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0x10])();
    iVar5 = CONCAT44(extraout_var_00,iVar4);
    func = instr->m_func;
    addrOpndKind = AddrOpndKindDynamicVar;
    goto LAB_005c11d0;
  default:
    goto switchD_005c1043_caseD_f;
  case ValueJavascriptArrayType:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0xd])();
    iVar5 = CONCAT44(extraout_var_10,iVar4);
    goto LAB_005c11c4;
  case ValueNativeIntArrayType:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0xe])();
    iVar5 = CONCAT44(extraout_var_11,iVar4);
    goto LAB_005c11c4;
  case ValueNativeFloatArrayType:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0xf])();
    iVar5 = CONCAT44(extraout_var_16,iVar4);
LAB_005c11c4:
    func = instr->m_func;
    addrOpndKind = AddrOpndKindDynamicType;
LAB_005c11d0:
    bVar3 = false;
    goto LAB_005c11d2;
  case ValueConstructorCacheDefaultInstance:
    iVar5 = ThreadContextInfo::GetConstructorCacheDefaultInstanceAddr
                      (this->m_func->m_threadContextInfo);
    func = instr->m_func;
    addrOpndKind = AddrOpndKindDynamicMisc;
    goto LAB_005c11d0;
  case ValueAbsDoubleCst:
    iVar5 = ThreadContextInfo::GetAbsDoubleCstAddr(this->m_func->m_threadContextInfo);
    pMVar6 = IR::MemRefOpnd::New(iVar5,TyFloat64,instr->m_func,AddrOpndKindDynamicDoubleRef);
    return &pMVar6->super_Opnd;
  case ValueCharStringCache:
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0x11])();
    iVar5 = CONCAT44(extraout_var_03,iVar4);
    func = instr->m_func;
    addrOpndKind = AddrOpndKindDynamicCharStringCache;
    goto LAB_005c11d0;
  }
  func = instr->m_func;
  addrOpndKind = AddrOpndKindDynamicVar;
LAB_005c119d:
  bVar3 = true;
LAB_005c11d2:
  pAVar8 = IR::AddrOpnd::New(iVar5,addrOpndKind,func,bVar3,(Var)0x0);
  return &pAVar8->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::LoadLibraryValueOpnd(IR::Instr * instr, LibraryValue valueType)
{
    ScriptContextInfo *scriptContextInfo = instr->m_func->GetScriptContextInfo();
    switch (valueType)
    {
    case LibraryValue::ValueEmptyString:
        return IR::AddrOpnd::New(scriptContextInfo->GetEmptyStringAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueUndeclBlockVar:
        return IR::AddrOpnd::New(scriptContextInfo->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueUndefined:
        return IR::AddrOpnd::New(scriptContextInfo->GetUndefinedAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueNull:
        return IR::AddrOpnd::New(scriptContextInfo->GetNullAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueTrue:
        return IR::AddrOpnd::New(scriptContextInfo->GetTrueAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueFalse:
        return IR::AddrOpnd::New(scriptContextInfo->GetFalseAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueNegativeZero:
        return IR::AddrOpnd::New(scriptContextInfo->GetNegativeZeroAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueNumberTypeStatic:
        return IR::AddrOpnd::New(scriptContextInfo->GetNumberTypeStaticAddr(), IR::AddrOpndKindDynamicType, instr->m_func, true);
    case LibraryValue::ValueStringTypeStatic:
        return IR::AddrOpnd::New(scriptContextInfo->GetStringTypeStaticAddr(), IR::AddrOpndKindDynamicType, instr->m_func, true);
    case LibraryValue::ValueSymbolTypeStatic:
        return IR::AddrOpnd::New(scriptContextInfo->GetSymbolTypeStaticAddr(), IR::AddrOpndKindDynamicType, instr->m_func, true);
    case LibraryValue::ValueObjectType:
        return IR::AddrOpnd::New(scriptContextInfo->GetObjectTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueObjectHeaderInlinedType:
        return IR::AddrOpnd::New(scriptContextInfo->GetObjectHeaderInlinedTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueRegexType:
        return IR::AddrOpnd::New(scriptContextInfo->GetRegexTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueArrayConstructor:
        return IR::AddrOpnd::New(scriptContextInfo->GetArrayConstructorAddr(), IR::AddrOpndKindDynamicVar, instr->m_func);
    case LibraryValue::ValueJavascriptArrayType:
        return IR::AddrOpnd::New(scriptContextInfo->GetArrayTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueNativeIntArrayType:
        return IR::AddrOpnd::New(scriptContextInfo->GetNativeIntArrayTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueNativeFloatArrayType:
        return IR::AddrOpnd::New(scriptContextInfo->GetNativeFloatArrayTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueConstructorCacheDefaultInstance:
        return IR::AddrOpnd::New(m_func->GetThreadContextInfo()->GetConstructorCacheDefaultInstanceAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func);
    case LibraryValue::ValueAbsDoubleCst:
        return IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetAbsDoubleCstAddr(), TyMachDouble, instr->m_func, IR::AddrOpndKindDynamicDoubleRef);
    case LibraryValue::ValueCharStringCache:
        return IR::AddrOpnd::New(scriptContextInfo->GetCharStringCacheAddr(), IR::AddrOpndKindDynamicCharStringCache, instr->m_func);
    default:
        Assert(UNREACHED);
        return nullptr;
    }
}